

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

uint32_t getDFDNumComponents(uint32_t *DFD)

{
  uint uVar1;
  uint32_t sampleChannel;
  uint32_t sampleNumber;
  uint32_t numSamples;
  uint32_t numComponents;
  uint32_t currentChannel;
  uint32_t *BDFDB;
  uint32_t *DFD_local;
  
  currentChannel = 0xffffffff;
  numComponents = 0;
  for (sampleNumber = 0; sampleNumber < (DFD[2] >> 0x12) - 6 >> 2; sampleNumber = sampleNumber + 1)
  {
    uVar1 = DFD[(ulong)(sampleNumber * 4 + 6) + 1] >> 0x18 & 0xf;
    if (uVar1 != currentChannel) {
      numComponents = numComponents + 1;
      currentChannel = uVar1;
    }
  }
  return numComponents;
}

Assistant:

uint32_t getDFDNumComponents(const uint32_t* DFD)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t currentChannel = ~0U; /* Don't start matched. */
    uint32_t numComponents = 0;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;

    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleNumber, CHANNELID);
        if (sampleChannel != currentChannel) {
            numComponents++;
            currentChannel = sampleChannel;
        }
    }
    return numComponents;
}